

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

void hts_idx_destroy(hts_idx_t *idx)

{
  kh_bin_t *h;
  bidx_t *bidx;
  int i;
  khint_t k;
  hts_idx_t *idx_local;
  
  if (idx != (hts_idx_t *)0x0) {
    if (idx->fmt == 3) {
      free(idx);
    }
    else {
      for (bidx._0_4_ = 0; (int)bidx < idx->m; bidx._0_4_ = (int)bidx + 1) {
        h = idx->bidx[(int)bidx];
        free(idx->lidx[(int)bidx].offset);
        if (h != (kh_bin_t *)0x0) {
          for (bidx._4_4_ = 0; bidx._4_4_ != h->n_buckets; bidx._4_4_ = bidx._4_4_ + 1) {
            if ((h->flags[bidx._4_4_ >> 4] >> (sbyte)((bidx._4_4_ & 0xf) << 1) & 3) == 0) {
              free(h->vals[bidx._4_4_].list);
            }
          }
          kh_destroy_bin(h);
        }
      }
      free(idx->bidx);
      free(idx->lidx);
      free(idx->meta);
      free(idx);
    }
  }
  return;
}

Assistant:

void hts_idx_destroy(hts_idx_t *idx)
{
    khint_t k;
    int i;
    if (idx == 0) return;
    // For HTS_FMT_CRAI, idx actually points to a different type -- see sam.c
    if (idx->fmt == HTS_FMT_CRAI) { free(idx); return; }

    for (i = 0; i < idx->m; ++i) {
        bidx_t *bidx = idx->bidx[i];
        free(idx->lidx[i].offset);
        if (bidx == 0) continue;
        for (k = kh_begin(bidx); k != kh_end(bidx); ++k)
            if (kh_exist(bidx, k))
                free(kh_value(bidx, k).list);
        kh_destroy(bin, bidx);
    }
    free(idx->bidx); free(idx->lidx); free(idx->meta);
    free(idx);
}